

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O2

ptr<log_entry> nuraft::inmem_log_store::make_clone(ptr<log_entry> *entry)

{
  buffer *__child_stack;
  void *in_RCX;
  int __flags;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  ptr<log_entry> pVar1;
  undefined1 local_41;
  undefined1 local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  undefined8 local_30;
  element_type *local_28;
  
  local_28 = (element_type *)((log_entry *)*in_RSI)->term_;
  __child_stack = log_entry::get_buf((log_entry *)*in_RSI);
  buffer::clone((__fn *)local_40,__child_stack,__flags,in_RCX);
  local_41 = *(undefined1 *)(*in_RSI + 8);
  local_30 = *(undefined8 *)(*in_RSI + 0x20);
  std::
  make_shared<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type,unsigned_long>
            ((unsigned_long *)entry,(shared_ptr<nuraft::buffer> *)&local_28,local_40,
             (unsigned_long *)&local_41);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  pVar1.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)entry;
  return (ptr<log_entry>)pVar1.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<log_entry> inmem_log_store::make_clone(const ptr<log_entry>& entry) {
    // NOTE:
    //   Timestamp is used only when `replicate_log_timestamp_` option is on.
    //   Otherwise, log store does not need to store or load it.
    ptr<log_entry> clone = cs_new<log_entry>
                           ( entry->get_term(),
                             buffer::clone( entry->get_buf() ),
                             entry->get_val_type(),
                             entry->get_timestamp() );
    return clone;
}